

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

pointer __thiscall
QList<GPollFDWithQSocketNotifier_*>::data(QList<GPollFDWithQSocketNotifier_*> *this)

{
  QArrayDataPointer<GPollFDWithQSocketNotifier_*> *this_00;
  GPollFDWithQSocketNotifier **ppGVar1;
  QArrayDataPointer<GPollFDWithQSocketNotifier_*> *in_RDI;
  
  detach((QList<GPollFDWithQSocketNotifier_*> *)0x8d0f4c);
  this_00 = (QArrayDataPointer<GPollFDWithQSocketNotifier_*> *)
            QArrayDataPointer<GPollFDWithQSocketNotifier_*>::operator->(in_RDI);
  ppGVar1 = QArrayDataPointer<GPollFDWithQSocketNotifier_*>::data(this_00);
  return ppGVar1;
}

Assistant:

pointer data() { detach(); return d->data(); }